

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3PoslistMerge(char **pp,char **pp1,char **pp2)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uchar *q;
  byte *__dest;
  byte *pbVar7;
  byte *p;
  byte *p_00;
  long lVar8;
  size_t __n;
  long lVar9;
  long lVar10;
  sqlite3_int64 iVal;
  int iCol2;
  int iCol1;
  long local_58;
  int local_50;
  int local_4c;
  char **local_48;
  char **local_40;
  char **local_38;
  
  __dest = (byte *)*pp;
  p_00 = (byte *)*pp1;
  p = (byte *)*pp2;
  local_48 = pp;
  local_40 = pp1;
  local_38 = pp2;
  do {
    while( true ) {
      if ((*p_00 == 0) && (*p == 0)) {
        *__dest = 0;
        *local_48 = (char *)(__dest + 1);
        *local_40 = (char *)(p_00 + 1);
        *local_38 = (char *)(p + 1);
        return;
      }
      if (*p_00 == 0) {
        local_4c = 0x7fffffff;
        iVar4 = local_4c;
      }
      else if (*p_00 == 1) {
        iVar4 = (int)(char)p_00[1];
        if ((char)p_00[1] < '\0') {
          sqlite3Fts3GetVarint32((char *)(p_00 + 1),&local_4c);
          iVar4 = local_4c;
        }
      }
      else {
        local_4c = 0;
        iVar4 = local_4c;
      }
      local_4c = iVar4;
      if (*p == 0) {
        local_50 = 0x7fffffff;
        iVar4 = local_50;
      }
      else if (*p == 1) {
        iVar4 = (int)(char)p[1];
        if ((char)p[1] < '\0') {
          sqlite3Fts3GetVarint32((char *)(p + 1),&local_50);
          iVar4 = local_50;
        }
      }
      else {
        local_50 = 0;
        iVar4 = local_50;
      }
      local_50 = iVar4;
      if (local_4c == local_50) break;
      if (local_4c < local_50) {
        if (local_4c == 0) {
          lVar5 = 0;
        }
        else {
          lVar5 = 1;
          uVar6 = (long)local_4c;
          do {
            lVar8 = lVar5;
            bVar1 = (byte)uVar6;
            __dest[lVar8] = bVar1 | 0x80;
            lVar5 = lVar8 + 1;
            bVar2 = 0x7f < uVar6;
            uVar6 = uVar6 >> 7;
          } while (bVar2);
          __dest[lVar8] = bVar1;
          *__dest = 1;
          __dest = __dest + lVar5;
        }
        pbVar7 = p_00 + lVar5;
        bVar1 = p_00[lVar5];
        p_00 = pbVar7;
        if (1 < bVar1) {
          do {
            bVar3 = bVar1 & 0x80;
            bVar1 = p_00[1];
            p_00 = p_00 + 1;
          } while ((bVar1 & 0xfe) != 0 || bVar3 != 0);
        }
        iVar4 = (int)p_00;
      }
      else {
        if (local_50 == 0) {
          lVar5 = 0;
        }
        else {
          lVar5 = 1;
          uVar6 = (long)local_50;
          do {
            lVar8 = lVar5;
            bVar1 = (byte)uVar6;
            __dest[lVar8] = bVar1 | 0x80;
            lVar5 = lVar8 + 1;
            bVar2 = 0x7f < uVar6;
            uVar6 = uVar6 >> 7;
          } while (bVar2);
          __dest[lVar8] = bVar1;
          *__dest = 1;
          __dest = __dest + lVar5;
        }
        pbVar7 = p + lVar5;
        bVar1 = p[lVar5];
        p = pbVar7;
        if (1 < bVar1) {
          do {
            bVar3 = bVar1 & 0x80;
            bVar1 = p[1];
            p = p + 1;
          } while ((bVar1 & 0xfe) != 0 || bVar3 != 0);
        }
        iVar4 = (int)p;
      }
      __n = (size_t)(iVar4 - (int)pbVar7);
      memcpy(__dest,pbVar7,__n);
      __dest = __dest + __n;
    }
    if (local_4c == 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = 1;
      uVar6 = (long)local_4c;
      do {
        lVar8 = lVar5;
        bVar1 = (byte)uVar6;
        __dest[lVar8] = bVar1 | 0x80;
        lVar5 = lVar8 + 1;
        bVar2 = 0x7f < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar2);
      __dest[lVar8] = bVar1;
      *__dest = 1;
      __dest = __dest + lVar5;
    }
    iVar4 = sqlite3Fts3GetVarint((char *)(p_00 + lVar5),&local_58);
    lVar8 = local_58;
    p_00 = p_00 + lVar5 + iVar4;
    iVar4 = sqlite3Fts3GetVarint((char *)(p + lVar5),&local_58);
    p = p + lVar5 + iVar4;
    lVar10 = 0;
    lVar5 = local_58;
    do {
      lVar9 = lVar5;
      if (lVar8 < lVar5) {
        lVar9 = lVar8;
      }
      uVar6 = lVar9 - lVar10;
      do {
        pbVar7 = __dest;
        bVar1 = (byte)uVar6;
        *pbVar7 = bVar1 | 0x80;
        __dest = pbVar7 + 1;
        bVar2 = 0x7f < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar2);
      *pbVar7 = bVar1;
      if (lVar8 == lVar5) {
        if (*p_00 < 2) {
          lVar8 = 0x7fffffff;
        }
        else {
          iVar4 = sqlite3Fts3GetVarint((char *)p_00,&local_58);
          p_00 = p_00 + iVar4;
          lVar8 = lVar8 + local_58 + -2;
        }
LAB_001817c3:
        if (*p < 2) {
          lVar5 = 0x7fffffff;
        }
        else {
          iVar4 = sqlite3Fts3GetVarint((char *)p,&local_58);
          p = p + iVar4;
          lVar5 = lVar5 + local_58 + -2;
        }
      }
      else {
        if (lVar5 <= lVar8) goto LAB_001817c3;
        if (*p_00 < 2) {
          lVar8 = 0x7fffffff;
        }
        else {
          iVar4 = sqlite3Fts3GetVarint((char *)p_00,&local_58);
          p_00 = p_00 + iVar4;
          lVar8 = lVar8 + local_58 + -2;
        }
      }
      lVar10 = lVar9 + -2;
    } while ((lVar8 != 0x7fffffff) || (lVar5 != 0x7fffffff));
  } while( true );
}

Assistant:

static void fts3PoslistMerge(
  char **pp,                      /* Output buffer */
  char **pp1,                     /* Left input list */
  char **pp2                      /* Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;

  while( *p1 || *p2 ){
    int iCol1;         /* The current column index in pp1 */
    int iCol2;         /* The current column index in pp2 */

    if( *p1==POS_COLUMN ) fts3GetVarint32(&p1[1], &iCol1);
    else if( *p1==POS_END ) iCol1 = POSITION_LIST_END;
    else iCol1 = 0;

    if( *p2==POS_COLUMN ) fts3GetVarint32(&p2[1], &iCol2);
    else if( *p2==POS_END ) iCol2 = POSITION_LIST_END;
    else iCol2 = 0;

    if( iCol1==iCol2 ){
      sqlite3_int64 i1 = 0;       /* Last position from pp1 */
      sqlite3_int64 i2 = 0;       /* Last position from pp2 */
      sqlite3_int64 iPrev = 0;
      int n = fts3PutColNumber(&p, iCol1);
      p1 += n;
      p2 += n;

      /* At this point, both p1 and p2 point to the start of column-lists
      ** for the same column (the column with index iCol1 and iCol2).
      ** A column-list is a list of non-negative delta-encoded varints, each 
      ** incremented by 2 before being stored. Each list is terminated by a
      ** POS_END (0) or POS_COLUMN (1). The following block merges the two lists
      ** and writes the results to buffer p. p is left pointing to the byte
      ** after the list written. No terminator (POS_END or POS_COLUMN) is
      ** written to the output.
      */
      fts3GetDeltaVarint(&p1, &i1);
      fts3GetDeltaVarint(&p2, &i2);
      do {
        fts3PutDeltaVarint(&p, &iPrev, (i1<i2) ? i1 : i2); 
        iPrev -= 2;
        if( i1==i2 ){
          fts3ReadNextPos(&p1, &i1);
          fts3ReadNextPos(&p2, &i2);
        }else if( i1<i2 ){
          fts3ReadNextPos(&p1, &i1);
        }else{
          fts3ReadNextPos(&p2, &i2);
        }
      }while( i1!=POSITION_LIST_END || i2!=POSITION_LIST_END );
    }else if( iCol1<iCol2 ){
      p1 += fts3PutColNumber(&p, iCol1);
      fts3ColumnlistCopy(&p, &p1);
    }else{
      p2 += fts3PutColNumber(&p, iCol2);
      fts3ColumnlistCopy(&p, &p2);
    }
  }

  *p++ = POS_END;
  *pp = p;
  *pp1 = p1 + 1;
  *pp2 = p2 + 1;
}